

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

uint32_t spvtools::opt::anon_unknown_0::GetArrayLength
                   (DefUseManager *def_use_mgr,Instruction *array_type)

{
  uint uVar1;
  uint32_t uVar2;
  Instruction *this;
  
  if (array_type->opcode_ != OpTypeArray) {
    __assert_fail("array_type->opcode() == spv::Op::OpTypeArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x2b,
                  "uint32_t spvtools::opt::(anonymous namespace)::GetArrayLength(analysis::DefUseManager *, Instruction *)"
                 );
  }
  uVar1 = (array_type->has_result_id_ & 1) + 1;
  if (array_type->has_type_id_ == false) {
    uVar1 = (uint)array_type->has_result_id_;
  }
  uVar2 = Instruction::GetSingleWordOperand(array_type,uVar1 + 1);
  this = analysis::DefUseManager::GetDef(def_use_mgr,uVar2);
  if (this->opcode_ == OpConstant) {
    uVar2 = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      uVar2 = (uint)this->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(this,uVar2);
    return uVar2;
  }
  __assert_fail("array_length_inst->opcode() == spv::Op::OpConstant",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x2f,
                "uint32_t spvtools::opt::(anonymous namespace)::GetArrayLength(analysis::DefUseManager *, Instruction *)"
               );
}

Assistant:

uint32_t GetArrayLength(analysis::DefUseManager* def_use_mgr,
                        Instruction* array_type) {
  assert(array_type->opcode() == spv::Op::OpTypeArray);
  uint32_t const_int_id =
      array_type->GetSingleWordInOperand(kOpTypeArrayLengthInOperandIndex);
  Instruction* array_length_inst = def_use_mgr->GetDef(const_int_id);
  assert(array_length_inst->opcode() == spv::Op::OpConstant);
  return array_length_inst->GetSingleWordInOperand(
      kOpConstantValueInOperandIndex);
}